

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O0

void __thiscall hrgls::Message::~Message(Message *this)

{
  Message *this_local;
  
  if (this->m_private != (Message_private *)0x0) {
    if (this->m_private->Message != (hrgls_Message)0x0) {
      hrgls_MessageDestroy(this->m_private->Message);
    }
    if (this->m_private != (Message_private *)0x0) {
      operator_delete(this->m_private);
    }
  }
  return;
}

Assistant:

Message::~Message()
  {
    if (m_private) {
      if (m_private->Message) {
        hrgls_MessageDestroy(m_private->Message);
      }
      delete m_private;
    }
  }